

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O1

bool __thiscall
ON_ObjRef::SetParentIRef
          (ON_ObjRef *this,ON_InstanceRef *iref,ON_UUID iref_id,int idef_geometry_index)

{
  int *piVar1;
  bool bVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  char cVar5;
  char cVar6;
  int iVar7;
  TYPE TVar8;
  ON_Geometry *pOVar9;
  ON_Brep *pOVar10;
  int extraout_var;
  ON_Geometry *pOVar11;
  ON_Object *pOVar12;
  ON_ObjRef_IRefID *pOVar13;
  ON_Mesh *pOVar14;
  int extraout_var_00;
  ON_MeshComponentRef *proxy1;
  ON_SubD *this_00;
  long lVar15;
  long lVar16;
  undefined8 uVar17;
  ON_Xform *pOVar18;
  ON_Xform *pOVar19;
  byte bVar20;
  ON_Xform geometry_xform;
  ON_Xform local_130;
  ON_Xform local_b0;
  
  uVar17 = iref_id._0_8_;
  bVar20 = 0;
  if ((this->m__iref).m_count < 1) {
    if ((this->m_component_index).m_type != invalid_type) {
      if (this->m__proxy2 != (ON_Object *)0x0) {
        return false;
      }
      pOVar10 = ON_BrepParent(this->m_parent_geometry);
      if (pOVar10 == (ON_Brep *)0x0) {
        pOVar10 = ON_BrepParent(this->m_geometry);
      }
      if (pOVar10 == (ON_Brep *)0x0) {
        pOVar14 = ON_MeshParent(this->m_parent_geometry);
        if (pOVar14 == (ON_Mesh *)0x0) {
          pOVar14 = ON_MeshParent(this->m_geometry);
        }
        if (pOVar14 == (ON_Mesh *)0x0) {
          bVar2 = true;
LAB_0056575f:
          cVar6 = '\0';
        }
        else {
          bVar2 = false;
          if (4 < (this->m_component_index).m_type - mesh_vertex) goto LAB_0056575f;
          cVar6 = '\0';
          if (-1 < (this->m_component_index).m_index) {
            TVar8 = (*(this->m_geometry->super_ON_Object)._vptr_ON_Object[0x22])();
            bVar2 = false;
            if ((this->m_component_index).m_type != TVar8) goto LAB_0056575f;
            cVar6 = '\0';
            if ((this->m_component_index).m_index == extraout_var_00) {
              pOVar14 = ON_Mesh::Duplicate(pOVar14);
              iVar7 = (*(pOVar14->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1c])
                                (pOVar14,&iref->m_xform);
              if (((char)iVar7 == '\0') ||
                 (proxy1 = ON_Mesh::MeshComponent(pOVar14,this->m_component_index),
                 proxy1 == (ON_MeshComponentRef *)0x0)) {
                (*(pOVar14->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(pOVar14);
                bVar2 = false;
                goto LAB_0056575f;
              }
              this->m_geometry = &proxy1->super_ON_Geometry;
              this->m_parent_geometry = &pOVar14->super_ON_Geometry;
              SetProxy(this,(ON_Object *)proxy1,(ON_Object *)pOVar14,true);
              bVar2 = true;
              cVar6 = '\x01';
            }
          }
        }
        if (bVar2) {
LAB_00565765:
          bVar2 = true;
        }
        else {
LAB_0056577b:
          bVar2 = false;
        }
      }
      else if (((((this->m__proxy1 == (ON_Object *)0x0) || (this->m__proxy2 != (ON_Object *)0x0)) ||
                (this->m__proxy_ref_count == (int *)0x0)) ||
               ((*this->m__proxy_ref_count != 1 ||
                (this->m__proxy1 == &this->m_geometry->super_ON_Object)))) ||
              (iVar7 = (*(this->m_geometry->super_ON_Object)._vptr_ON_Object[0x22])(),
              extraout_var < 0 || 4 < iVar7 - 1U)) {
        bVar2 = false;
        cVar6 = '\0';
        if (this->m__proxy_ref_count == (int *)0x0 && this->m__proxy1 == (ON_Object *)0x0)
        goto LAB_005653ea;
      }
      else {
LAB_005653ea:
        bVar2 = false;
        cVar6 = '\0';
        if ((ON_Brep *)this->m_parent_geometry == pOVar10 ||
            (ON_Brep *)this->m_parent_geometry == (ON_Brep *)0x0) {
          pOVar9 = this->m_geometry;
          pOVar11 = ON_Brep::BrepComponent(pOVar10,this->m_component_index);
          bVar2 = false;
          cVar6 = '\0';
          if (pOVar9 == pOVar11) {
            pOVar10 = ON_Brep::Duplicate(pOVar10);
            iVar7 = (*(pOVar10->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1c])
                              (pOVar10,&iref->m_xform);
            if ((char)iVar7 == '\0') {
              (*(pOVar10->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(pOVar10);
              bVar2 = false;
LAB_00565775:
              cVar6 = '\0';
            }
            else {
              pOVar9 = ON_Brep::BrepComponent(pOVar10,this->m_component_index);
              bVar2 = pOVar9 != (ON_Geometry *)0x0;
              if (pOVar9 == (ON_Geometry *)0x0) goto LAB_00565775;
              SetProxy(this,(ON_Object *)0x0,(ON_Object *)pOVar10,true);
              this->m_geometry = pOVar9;
              this->m_parent_geometry = &pOVar10->super_ON_Geometry;
              bVar2 = true;
              cVar6 = '\x01';
            }
            if (bVar2) goto LAB_00565765;
            goto LAB_0056577b;
          }
        }
      }
      if (!bVar2) {
        return false;
      }
      goto LAB_005655af;
    }
    pOVar12 = this->m__proxy1;
    piVar1 = this->m__proxy_ref_count;
    if ((pOVar12 != (ON_Object *)0x0 || this->m__proxy2 != (ON_Object *)0x0) || piVar1 != (int *)0x0
       ) {
      if ((pOVar12 == (ON_Object *)0x0 || piVar1 == (int *)0x0) ||
          this->m__proxy2 != (ON_Object *)0x0) {
        return false;
      }
      if (*piVar1 != 1) {
        return false;
      }
      if (pOVar12 == &this->m_geometry->super_ON_Object) {
        return false;
      }
      pOVar10 = ON_Brep::Cast(&this->m_geometry->super_ON_Object);
      if (pOVar10 == (ON_Brep *)0x0) {
        return false;
      }
    }
    if (this->m_geometry == (ON_Geometry *)0x0) {
      return false;
    }
    iVar7 = (*(this->m_geometry->super_ON_Object)._vptr_ON_Object[0x22])();
    if (iVar7 != 0) {
      return false;
    }
    if (this->m_geometry != this->m_parent_geometry && this->m_parent_geometry != (ON_Geometry *)0x0
       ) {
      return false;
    }
    pOVar12 = &ON_Geometry::Duplicate(this->m_geometry)->super_ON_Object;
    iVar7 = (*pOVar12->_vptr_ON_Object[0x1c])(pOVar12);
    cVar5 = (char)iVar7;
    if (cVar5 == '\0') {
      (*pOVar12->_vptr_ON_Object[4])(pOVar12);
      cVar6 = '\0';
    }
    else {
      iVar7 = ON_Xform::IsSimilarity(&iref->m_xform);
      if (iVar7 == -1) {
        iVar7 = (*pOVar12->_vptr_ON_Object[0xc])(pOVar12);
        if (iVar7 == 0x40000) {
          this_00 = ON_SubD::Cast(pOVar12);
          if (this_00 != (ON_SubD *)0x0) {
            ON_SubD::ReverseOrientation(this_00);
          }
        }
        else if (iVar7 == 0x20) {
          pOVar14 = ON_Mesh::Cast(pOVar12);
          if (pOVar14 != (ON_Mesh *)0x0) {
            ON_Mesh::Flip(pOVar14);
          }
        }
        else if ((iVar7 == 0x10) && (pOVar10 = ON_Brep::Cast(pOVar12), pOVar10 != (ON_Brep *)0x0)) {
          ON_Brep::Flip(pOVar10);
        }
      }
      SetProxy(this,(ON_Object *)0x0,pOVar12,true);
      this->m_geometry = (ON_Geometry *)pOVar12;
      this->m_parent_geometry = (ON_Geometry *)pOVar12;
      cVar6 = '\x01';
    }
  }
  else {
    if (this->m__proxy2 == (ON_Object *)0x0) {
      return false;
    }
    if (this->m__proxy_ref_count == (int *)0x0) {
      return false;
    }
    if (*this->m__proxy_ref_count < 1) {
      return false;
    }
    pOVar9 = ON_Geometry::Cast(this->m__proxy2);
    if (pOVar9 == (ON_Geometry *)0x0) {
      cVar6 = '\0';
      cVar5 = cVar6;
    }
    else {
      iVar7 = (*(pOVar9->super_ON_Object)._vptr_ON_Object[0x1c])(pOVar9,&iref->m_xform);
      cVar6 = (char)iVar7;
      cVar5 = cVar6;
    }
  }
  if (cVar5 == '\0') {
    return false;
  }
LAB_005655af:
  if (cVar6 != '\0') {
    pOVar18 = &ON_Xform::IdentityTransformation;
    pOVar19 = &local_130;
    for (lVar15 = 0x10; lVar15 != 0; lVar15 = lVar15 + -1) {
      pOVar19->m_xform[0][0] = pOVar18->m_xform[0][0];
      pOVar18 = (ON_Xform *)((long)pOVar18 + ((ulong)bVar20 * -2 + 1) * 8);
      pOVar19 = (ON_Xform *)((long)pOVar19 + ((ulong)bVar20 * -2 + 1) * 8);
    }
    lVar15 = (long)(this->m__iref).m_count;
    if (0 < lVar15) {
      pOVar18 = &(this->m__iref).m_a[lVar15 + -1].m_geometry_xform;
      pOVar19 = &local_130;
      for (lVar16 = 0x10; lVar16 != 0; lVar16 = lVar16 + -1) {
        pOVar19->m_xform[0][0] = pOVar18->m_xform[0][0];
        pOVar18 = (ON_Xform *)((long)pOVar18 + (ulong)bVar20 * -0x10 + 8);
        pOVar19 = (ON_Xform *)((long)pOVar19 + ((ulong)bVar20 * -2 + 1) * 8);
      }
    }
    pOVar13 = ON_SimpleArray<ON_ObjRef_IRefID>::AppendNew(&this->m__iref);
    (pOVar13->m_iref_uuid).Data1 = (int)uVar17;
    (pOVar13->m_iref_uuid).Data2 = (short)((ulong)uVar17 >> 0x20);
    (pOVar13->m_iref_uuid).Data3 = (short)((ulong)uVar17 >> 0x30);
    *&(pOVar13->m_iref_uuid).Data4 = iref_id.Data4;
    pOVar18 = &iref->m_xform;
    pOVar19 = &pOVar13->m_iref_xform;
    for (lVar15 = 0x10; lVar15 != 0; lVar15 = lVar15 + -1) {
      pOVar19->m_xform[0][0] = pOVar18->m_xform[0][0];
      pOVar18 = (ON_Xform *)((long)pOVar18 + (ulong)bVar20 * -0x10 + 8);
      pOVar19 = (ON_Xform *)((long)pOVar19 + (ulong)bVar20 * -0x10 + 8);
    }
    uVar3 = (iref->m_instance_definition_uuid).Data2;
    uVar4 = (iref->m_instance_definition_uuid).Data3;
    uVar17 = *(undefined8 *)(iref->m_instance_definition_uuid).Data4;
    (pOVar13->m_idef_uuid).Data1 = (iref->m_instance_definition_uuid).Data1;
    (pOVar13->m_idef_uuid).Data2 = uVar3;
    (pOVar13->m_idef_uuid).Data3 = uVar4;
    *(undefined8 *)(pOVar13->m_idef_uuid).Data4 = uVar17;
    pOVar13->m_idef_geometry_index = idef_geometry_index;
    ON_Xform::operator*(&local_b0,&iref->m_xform,&local_130);
    pOVar18 = &local_b0;
    pOVar19 = &pOVar13->m_geometry_xform;
    for (lVar15 = 0x10; lVar15 != 0; lVar15 = lVar15 + -1) {
      pOVar19->m_xform[0][0] = pOVar18->m_xform[0][0];
      pOVar18 = (ON_Xform *)((long)pOVar18 + ((ulong)bVar20 * -2 + 1) * 8);
      pOVar19 = (ON_Xform *)((long)pOVar19 + (ulong)bVar20 * -0x10 + 8);
    }
    uVar3 = (pOVar13->m_iref_uuid).Data2;
    uVar4 = (pOVar13->m_iref_uuid).Data3;
    uVar17 = *(undefined8 *)(pOVar13->m_iref_uuid).Data4;
    (this->m_uuid).Data1 = (pOVar13->m_iref_uuid).Data1;
    (this->m_uuid).Data2 = uVar3;
    (this->m_uuid).Data3 = uVar4;
    *(undefined8 *)(this->m_uuid).Data4 = uVar17;
    return true;
  }
  return false;
}

Assistant:

bool ON_ObjRef::SetParentIRef( const ON_InstanceRef& iref,
                               ON_UUID iref_id,
                               int idef_geometry_index
                               )
{
  bool rc = false;

  if ( m__iref.Count() > 0 )
  {
    // nested irefs
    if (    0 == m__proxy2
         || 0 == m__proxy_ref_count 
         || *m__proxy_ref_count <= 0 )
    {
      return false;
    }
    ON_Geometry* proxy_geo = ON_Geometry::Cast(m__proxy2);
    if ( !proxy_geo )
      return false;
    if ( !proxy_geo->Transform(iref.m_xform) )
      return false;
    rc = true;
  }
  else if ( ON_COMPONENT_INDEX::invalid_type == m_component_index.m_type )
  {
    // handle top level objects    
    while ( m__proxy1 || m__proxy2 || m__proxy_ref_count )
    {
      // It it's an brep proxy for an extrusion object, then keep going.
      if (    0 != m__proxy1
           && 0 == m__proxy2 
           && 0 != m__proxy_ref_count 
           && 1 == *m__proxy_ref_count 
           && m__proxy1 != m_geometry
           && 0 != ON_Brep::Cast(m_geometry)
           )
      {
        // 13 July 2011 - Part of the fix for bug 87827
        // is to break here instead of returning false
        // because we have something like a brep proxy 
        // of an extrusion.
        break;        
      }
      return false;
    }

    if ( !m_geometry )
    {
      return false;
    }
    if ( m_geometry->ComponentIndex().m_type != ON_COMPONENT_INDEX::invalid_type )
    {
      return false;
    }
    if ( m_parent_geometry && m_geometry != m_parent_geometry )
    {
      return false;
    }
    ON_Geometry* proxy_geo = m_geometry->Duplicate();
    if ( !proxy_geo->Transform(iref.m_xform) )
    {
      delete proxy_geo;
      return false;
    }

    // 24 June 2024, Mikko, RH-82669:
    // Flip brep/mesh/SubD if the xform is orientation reversing.
    if (-1 == iref.m_xform.IsSimilarity())
    {
      switch (proxy_geo->ObjectType())
      {
      case ON::object_type::brep_object:
      {
        ON_Brep* brep = ON_Brep::Cast(proxy_geo);
        if (0 != brep)
          brep->Flip();
      }
      break;

      case ON::object_type::mesh_object:
      {
        ON_Mesh* mesh = ON_Mesh::Cast(proxy_geo);
        if (0 != mesh)
          mesh->Flip();
      }
      break;

      case ON::object_type::subd_object:
      {
        ON_SubD* subd = ON_SubD::Cast(proxy_geo);
        if (0 != subd)
          subd->ReverseOrientation();
      }
      break;

      default:
        break;
      }
    }

    // 13 July 2011 - Part of the fix for bug 87827
    // was to put the m_geometry and m_parent_geometry
    // assignments after the call to SetProxy() which
    // was zeroing m_geometry and m_parent_geometry.
    SetProxy(0,proxy_geo,true);
    m_geometry = proxy_geo;
    m_parent_geometry = proxy_geo;
    rc = true;
  }
  else
  {
    // handle brep and mesh subobjects
    // create proxy object
    if ( m__proxy2 )
      return false;

    const ON_Brep* parent_brep = ON_BrepParent(m_parent_geometry);
    if ( !parent_brep)
      parent_brep = ON_BrepParent(m_geometry);
    if ( parent_brep )
    {
      // handle breps and their parts

      // 6 June 2013, Mikko, RH-9846:
      // This is a near facsimile of the 87827 fix above.
      // If it's a brep proxy component for an extrusion object, then keep going.
      if (    0 != m__proxy1
           && 0 == m__proxy2 
           && 0 != m__proxy_ref_count 
           && 1 == *m__proxy_ref_count 
           && m__proxy1 != m_geometry
           && m_geometry->ComponentIndex().IsBrepComponentIndex()
           )
      {
        // brep proxy component for an extrusion object, keep going
      }
      else
      if ( m__proxy1 || m__proxy_ref_count )
      {
        return false;
      }
      if ( m_parent_geometry != parent_brep && 0 != m_parent_geometry )
      {
        return false;
      }
      if ( m_geometry != parent_brep->BrepComponent(m_component_index) )
      {
        return false;
      }
      ON_Brep* proxy_brep = parent_brep->Duplicate();
      if ( !proxy_brep->Transform(iref.m_xform) )
      {
        delete proxy_brep;
        return false;
      }
      const ON_Geometry* brep_component = proxy_brep->BrepComponent(m_component_index);
      if ( !brep_component )
      {
        delete brep_component;
        return false;
      }
      SetProxy(0,proxy_brep,true);
      m_geometry        = brep_component;
      m_parent_geometry = proxy_brep;
      rc = true;
    }
    else
    {
      const ON_Mesh* parent_mesh = ON_MeshParent(m_parent_geometry);
      if ( !parent_mesh)
        parent_mesh = ON_MeshParent(m_geometry);
      if ( parent_mesh  )
      {
        // handle meshes and their parts
        if ( m_component_index.IsMeshComponentIndex() )
        {
          if ( m_geometry->ComponentIndex() != m_component_index )
            return false;
          ON_Mesh* proxy_mesh = parent_mesh->Duplicate();
          if ( !proxy_mesh->Transform(iref.m_xform) )
          {
            delete proxy_mesh;
            return false;
          }
          ON_Geometry* proxy_component = proxy_mesh->MeshComponent(m_component_index);
          if( !proxy_component )
          {
            delete proxy_mesh;
            return false;
          }
          m_geometry = proxy_component;
          m_parent_geometry = proxy_mesh;
          SetProxy(proxy_component,proxy_mesh,true);
          rc = true;
        }
        else
        {
          return false;
        }
      }
    }
  }

  if ( rc )
  {
    // This is a valid reference to a piece of geometry
    // in an instance definition.

    ON_Xform geometry_xform(ON_Xform::IdentityTransformation);
    if ( m__iref.Count() > 0 )
      geometry_xform = m__iref.Last()->m_geometry_xform;

    ON_ObjRef_IRefID& this_ref     = m__iref.AppendNew();
    this_ref.m_iref_uuid           = iref_id;
    this_ref.m_iref_xform          = iref.m_xform;
    this_ref.m_idef_uuid           = iref.m_instance_definition_uuid;
    this_ref.m_idef_geometry_index = idef_geometry_index;
    this_ref.m_geometry_xform      = iref.m_xform*geometry_xform;

    m_uuid = this_ref.m_iref_uuid;
  }

  return rc;
}